

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

bool __thiscall
ON_ObjectArray<ON_BrepRegion>::HeapSort
          (ON_ObjectArray<ON_BrepRegion> *this,_func_int_ON_BrepRegion_ptr_ON_BrepRegion_ptr *compar
          )

{
  uint uVar1;
  ON_BrepRegion *pOVar2;
  long lVar3;
  long lVar4;
  
  pOVar2 = (this->super_ON_ClassArray<ON_BrepRegion>).m_a;
  if (pOVar2 != (ON_BrepRegion *)0x0) {
    uVar1 = (this->super_ON_ClassArray<ON_BrepRegion>).m_count;
    if (compar != (_func_int_ON_BrepRegion_ptr_ON_BrepRegion_ptr *)0x0 && 0 < (long)(int)uVar1) {
      if (uVar1 < 2) {
        return true;
      }
      ON_hsort(pOVar2,(long)(int)uVar1,0x78,(_func_int_void_ptr_void_ptr *)compar);
      lVar4 = 0;
      for (lVar3 = 0; lVar3 < (this->super_ON_ClassArray<ON_BrepRegion>).m_count; lVar3 = lVar3 + 1)
      {
        pOVar2 = (this->super_ON_ClassArray<ON_BrepRegion>).m_a;
        (**(code **)(*(long *)((long)&(pOVar2->super_ON_Object)._vptr_ON_Object + lVar4) + 0x28))
                  ((long)&(pOVar2->super_ON_Object)._vptr_ON_Object + lVar4);
        lVar4 = lVar4 + 0x78;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_ObjectArray<T>::HeapSort( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  // The "this->" in this->m_count and this->m_a 
  // are needed for gcc 4 to compile.
  if ( this->m_a && this->m_count > 0 && compar ) 
  {
    if ( this->m_count > 1 )
    {
      ON_hsort( this->m_a, this->m_count, sizeof(T), (int(*)(const void*,const void*))compar );
      
      // The MemoryRelocate step is required to synch userdata back pointers
      // so the user data destructor will work correctly.
      int i;
      for ( i = 0; i < this->m_count; i++ )
      {
        this->m_a[i].MemoryRelocate();
      }
    }
    rc = true;
  }
  return rc;
}